

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O0

void __thiscall banksia::WbEngine::tickWork(WbEngine *this)

{
  PlayerState PVar1;
  uint uVar2;
  void *__buf;
  Engine *in_RDI;
  Engine *unaff_retaddr;
  allocator local_29;
  string local_28 [40];
  size_t __n;
  
  Engine::tickWork(unaff_retaddr);
  PVar1 = Player::getState(&in_RDI->super_Player);
  if (PVar1 == starting) {
    if (*(int *)((long)&in_RDI[1].super_Player.moveReceiver.super__Function_base._M_functor + 4) < 1
       ) {
      if ((0x14 < (in_RDI->super_Player).tick_state) && (in_RDI->correctCmdCnt < 2)) {
        Player::setState(&in_RDI->super_Player,stopped);
      }
    }
    else {
      uVar2 = *(int *)((long)&in_RDI[1].super_Player.moveReceiver.super__Function_base._M_functor +
                      4) - 1;
      __n = (size_t)uVar2;
      *(uint *)((long)&in_RDI[1].super_Player.moveReceiver.super__Function_base._M_functor + 4) =
           uVar2;
      if (*(int *)((long)&in_RDI[1].super_Player.moveReceiver.super__Function_base._M_functor + 4)
          == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_28,"force",&local_29);
        Engine::write(in_RDI,(int)local_28,__buf,__n);
        std::__cxx11::string::~string(local_28);
        std::allocator<char>::~allocator((allocator<char> *)&local_29);
        if ((in_RDI[1].super_Player.moveReceiver.super__Function_base._M_functor._M_pod_data[10] &
            1U) != 0) {
          (*(in_RDI->super_Player).super_Obj._vptr_Obj[0x1f])();
        }
        Player::setState(&in_RDI->super_Player,ready);
      }
    }
  }
  return;
}

Assistant:

void WbEngine::tickWork()
{
    EngineProfile::tickWork();

    if (getState() == PlayerState::starting) {
        if (tick_delay_2_ready > 0) {
            tick_delay_2_ready--;
            if (tick_delay_2_ready == 0) {
                write("force");
                if (feature_ping) {
                    sendPing();
                }
                setState(PlayerState::ready);
            }
        } else if (tick_state > 10 * 2 && correctCmdCnt < 2) {
            // crashed
            setState(PlayerState::stopped);
        }
    }
}